

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3CreateView(Parse *pParse,Token *pBegin,Token *pName1,Token *pName2,ExprList *pCNames,
                      Select *pSelect,int isTemp,int noErr)

{
  sqlite3 *db_00;
  Table *pTVar1;
  int iVar2;
  Select *pSVar3;
  ExprList *pEVar4;
  sqlite3 *db;
  Token *pTStack_c8;
  int iDb;
  Token *pName;
  DbFixer sFix;
  Token sEnd;
  char *z;
  int n;
  Table *p;
  Select *pSelect_local;
  ExprList *pCNames_local;
  Token *pName2_local;
  Token *pName1_local;
  Token *pBegin_local;
  Parse *pParse_local;
  
  pTStack_c8 = (Token *)0x0;
  db_00 = pParse->db;
  p = (Table *)pSelect;
  if (pParse->nVar < 1) {
    sqlite3StartTable(pParse,pName1,pName2,isTemp,1,0,noErr);
    pTVar1 = pParse->pNewTable;
    if ((pTVar1 != (Table *)0x0) && (pParse->nErr == 0)) {
      pTVar1->tabFlags = pTVar1->tabFlags | 0x200;
      sqlite3TwoPartName(pParse,pName1,pName2,&stack0xffffffffffffff38);
      iVar2 = sqlite3SchemaToIndex(db_00,pTVar1->pSchema);
      sqlite3FixInit((DbFixer *)&pName,pParse,iVar2,"view",pTStack_c8);
      iVar2 = sqlite3FixSelect((DbFixer *)&pName,pSelect);
      if (iVar2 == 0) {
        pSelect->selFlags = pSelect->selFlags | 0x200000;
        if (pParse->eParseMode < 2) {
          pSVar3 = sqlite3SelectDup(db_00,pSelect,1);
          (pTVar1->u).view.pSelect = pSVar3;
        }
        else {
          (pTVar1->u).view.pSelect = pSelect;
          p = (Table *)0x0;
        }
        pEVar4 = sqlite3ExprListDup(db_00,pCNames,1);
        pTVar1->pCheck = pEVar4;
        pTVar1->eTabType = '\x02';
        if (db_00->mallocFailed == '\0') {
          sFix.pName = (Token *)(pParse->sLastToken).z;
          if (*(char *)&(sFix.pName)->z != ';') {
            sFix.pName = (Token *)((long)&(sFix.pName)->z +
                                  (*(ulong *)&(pParse->sLastToken).n & 0xffffffff));
          }
          z._4_4_ = (int)sFix.pName - (int)pBegin->z;
          while ((""[(byte)pBegin->z[z._4_4_ + -1]] & 1) != 0) {
            z._4_4_ = z._4_4_ + -1;
          }
          sFix.pName = (Token *)(pBegin->z + (z._4_4_ + -1));
          sqlite3EndTable(pParse,(Token *)0x0,(Token *)&sFix.pName,0,(Select *)0x0);
        }
      }
    }
  }
  else {
    sqlite3ErrorMsg(pParse,"parameters are not allowed in views");
  }
  sqlite3SelectDelete(db_00,(Select *)p);
  if (1 < pParse->eParseMode) {
    sqlite3RenameExprlistUnmap(pParse,pCNames);
  }
  sqlite3ExprListDelete(db_00,pCNames);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CreateView(
  Parse *pParse,     /* The parsing context */
  Token *pBegin,     /* The CREATE token that begins the statement */
  Token *pName1,     /* The token that holds the name of the view */
  Token *pName2,     /* The token that holds the name of the view */
  ExprList *pCNames, /* Optional list of view column names */
  Select *pSelect,   /* A SELECT statement that will become the new view */
  int isTemp,        /* TRUE for a TEMPORARY view */
  int noErr          /* Suppress error messages if VIEW already exists */
){
  Table *p;
  int n;
  const char *z;
  Token sEnd;
  DbFixer sFix;
  Token *pName = 0;
  int iDb;
  sqlite3 *db = pParse->db;

  if( pParse->nVar>0 ){
    sqlite3ErrorMsg(pParse, "parameters are not allowed in views");
    goto create_view_fail;
  }
  sqlite3StartTable(pParse, pName1, pName2, isTemp, 1, 0, noErr);
  p = pParse->pNewTable;
  if( p==0 || pParse->nErr ) goto create_view_fail;

  /* Legacy versions of SQLite allowed the use of the magic "rowid" column
  ** on a view, even though views do not have rowids.  The following flag
  ** setting fixes this problem.  But the fix can be disabled by compiling
  ** with -DSQLITE_ALLOW_ROWID_IN_VIEW in case there are legacy apps that
  ** depend upon the old buggy behavior. */
#ifndef SQLITE_ALLOW_ROWID_IN_VIEW
  p->tabFlags |= TF_NoVisibleRowid;
#endif

  sqlite3TwoPartName(pParse, pName1, pName2, &pName);
  iDb = sqlite3SchemaToIndex(db, p->pSchema);
  sqlite3FixInit(&sFix, pParse, iDb, "view", pName);
  if( sqlite3FixSelect(&sFix, pSelect) ) goto create_view_fail;

  /* Make a copy of the entire SELECT statement that defines the view.
  ** This will force all the Expr.token.z values to be dynamically
  ** allocated rather than point to the input string - which means that
  ** they will persist after the current sqlite3_exec() call returns.
  */
  pSelect->selFlags |= SF_View;
  if( IN_RENAME_OBJECT ){
    p->u.view.pSelect = pSelect;
    pSelect = 0;
  }else{
    p->u.view.pSelect = sqlite3SelectDup(db, pSelect, EXPRDUP_REDUCE);
  }
  p->pCheck = sqlite3ExprListDup(db, pCNames, EXPRDUP_REDUCE);
  p->eTabType = TABTYP_VIEW;
  if( db->mallocFailed ) goto create_view_fail;

  /* Locate the end of the CREATE VIEW statement.  Make sEnd point to
  ** the end.
  */
  sEnd = pParse->sLastToken;
  assert( sEnd.z[0]!=0 || sEnd.n==0 );
  if( sEnd.z[0]!=';' ){
    sEnd.z += sEnd.n;
  }
  sEnd.n = 0;
  n = (int)(sEnd.z - pBegin->z);
  assert( n>0 );
  z = pBegin->z;
  while( sqlite3Isspace(z[n-1]) ){ n--; }
  sEnd.z = &z[n-1];
  sEnd.n = 1;

  /* Use sqlite3EndTable() to add the view to the schema table */
  sqlite3EndTable(pParse, 0, &sEnd, 0, 0);

create_view_fail:
  sqlite3SelectDelete(db, pSelect);
  if( IN_RENAME_OBJECT ){
    sqlite3RenameExprlistUnmap(pParse, pCNames);
  }
  sqlite3ExprListDelete(db, pCNames);
  return;
}